

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O3

Am_Load_Save_Context __thiscall
Am_Load_Save_Context::Narrow(Am_Load_Save_Context *this,Am_Wrapper *in_data)

{
  Am_ID_Tag AVar1;
  int iVar2;
  
  AVar1 = Am_Load_Save_Context_Data::id;
  if (in_data != (Am_Wrapper *)0x0) {
    iVar2 = (**(in_data->super_Am_Registered_Type)._vptr_Am_Registered_Type)(in_data);
    if (AVar1 != (Am_ID_Tag)iVar2) {
      Am_Error();
    }
  }
  this->data = (Am_Load_Save_Context_Data *)in_data;
  return (Am_Load_Save_Context)(Am_Load_Save_Context_Data *)this;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}